

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataTypeRegister.cpp
# Opt level: O0

void __thiscall Rml::DataTypeRegister::DataTypeRegister(DataTypeRegister *this)

{
  anon_class_1_0_00000001 local_159;
  DataTransformFunc local_158;
  allocator<char> local_131;
  String local_130;
  anon_class_1_0_00000001 local_109;
  DataTransformFunc local_108;
  allocator<char> local_e1;
  String local_e0;
  anon_class_1_0_00000001 local_b9;
  DataTransformFunc local_b8;
  allocator<char> local_91;
  String local_90;
  anon_class_1_0_00000001 local_69;
  DataTransformFunc local_68;
  allocator<char> local_31;
  String local_30;
  DataTypeRegister *local_10;
  DataTypeRegister *this_local;
  
  local_10 = this;
  NonCopyMoveable::NonCopyMoveable((NonCopyMoveable *)this);
  robin_hood::detail::
  Table<true,_80UL,_Rml::FamilyId,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>,_robin_hood::hash<Rml::FamilyId,_void>,_std::equal_to<Rml::FamilyId>_>
  ::Table(&this->type_register);
  TransformFuncRegister::TransformFuncRegister(&this->transform_register);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"to_lower",&local_31);
  ::std::function<Rml::Variant(std::vector<Rml::Variant,std::allocator<Rml::Variant>>const&)>::
  function<Rml::DataTypeRegister::DataTypeRegister()::__0,void>
            ((function<Rml::Variant(std::vector<Rml::Variant,std::allocator<Rml::Variant>>const&)> *
             )&local_68,&local_69);
  TransformFuncRegister::Register(&this->transform_register,&local_30,&local_68);
  ::std::function<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>::
  ~function(&local_68);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::allocator<char>::~allocator(&local_31);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"to_upper",&local_91);
  ::std::function<Rml::Variant(std::vector<Rml::Variant,std::allocator<Rml::Variant>>const&)>::
  function<Rml::DataTypeRegister::DataTypeRegister()::__1,void>
            ((function<Rml::Variant(std::vector<Rml::Variant,std::allocator<Rml::Variant>>const&)> *
             )&local_b8,&local_b9);
  TransformFuncRegister::Register(&this->transform_register,&local_90,&local_b8);
  ::std::function<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>::
  ~function(&local_b8);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::allocator<char>::~allocator(&local_91);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"format",&local_e1);
  ::std::function<Rml::Variant(std::vector<Rml::Variant,std::allocator<Rml::Variant>>const&)>::
  function<Rml::DataTypeRegister::DataTypeRegister()::__2,void>
            ((function<Rml::Variant(std::vector<Rml::Variant,std::allocator<Rml::Variant>>const&)> *
             )&local_108,&local_109);
  TransformFuncRegister::Register(&this->transform_register,&local_e0,&local_108);
  ::std::function<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>::
  ~function(&local_108);
  ::std::__cxx11::string::~string((string *)&local_e0);
  ::std::allocator<char>::~allocator(&local_e1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"round",&local_131);
  ::std::function<Rml::Variant(std::vector<Rml::Variant,std::allocator<Rml::Variant>>const&)>::
  function<Rml::DataTypeRegister::DataTypeRegister()::__3,void>
            ((function<Rml::Variant(std::vector<Rml::Variant,std::allocator<Rml::Variant>>const&)> *
             )&local_158,&local_159);
  TransformFuncRegister::Register(&this->transform_register,&local_130,&local_158);
  ::std::function<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>::
  ~function(&local_158);
  ::std::__cxx11::string::~string((string *)&local_130);
  ::std::allocator<char>::~allocator(&local_131);
  return;
}

Assistant:

DataTypeRegister::DataTypeRegister()
{
	// Add default transform functions.

	transform_register.Register("to_lower", [](const VariantList& arguments) -> Variant {
		if (arguments.size() != 1)
			return {};
		String value;
		if (!arguments[0].GetInto(value))
			return {};
		return Variant(StringUtilities::ToLower(std::move(value)));
	});

	transform_register.Register("to_upper", [](const VariantList& arguments) -> Variant {
		if (arguments.size() != 1)
			return {};
		String value;
		if (!arguments[0].GetInto(value))
			return {};
		return Variant(StringUtilities::ToUpper(value));
	});

	transform_register.Register("format", [](const VariantList& arguments) -> Variant {
		// Arguments in:
		//   0 : number     Number to format.
		//   1 : int[0,32]  Precision. Number of digits after the decimal point.
		//  [2]: bool       True to remove trailing zeros (default = false).
		if (arguments.empty() || arguments.size() > 3)
		{
			Log::Message(Log::LT_WARNING, "Transform function 'format' requires at least two arguments, at most three arguments.");
			return {};
		}
		int precision = 0;
		if (!arguments[1].GetInto(precision) || precision < 0 || precision > 32)
		{
			Log::Message(Log::LT_WARNING, "Transform function 'format': Second argument must be an integer in [0, 32].");
			return {};
		}
		bool remove_trailing_zeros = false;
		if (arguments.size() >= 3)
		{
			if (!arguments[2].GetInto(remove_trailing_zeros))
				return {};
		}

		double value = 0;
		if (!arguments[0].GetInto(value))
			return {};

		String format_specifier = String(remove_trailing_zeros ? "%#." : "%.") + ToString(precision) + 'f';
		String result;
		if (FormatString(result, format_specifier.c_str(), value) == 0)
			return {};

		if (remove_trailing_zeros)
			StringUtilities::TrimTrailingDotZeros(result);

		return Variant(std::move(result));
	});

	transform_register.Register("round", [](const VariantList& arguments) -> Variant {
		if (arguments.size() != 1)
			return {};
		double value;
		if (!arguments[0].GetInto(value))
			return {};
		return Variant(Math::Round(value));
	});
}